

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_impl.h
# Opt level: O2

RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
google::protobuf::internal::TcParser::
MaybeCreateRepeatedRefAt<google::protobuf::RepeatedPtrField<std::__cxx11::string>,true>
          (void *x,size_t offset,MessageLite *msg)

{
  void **ppvVar1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar2;
  Arena *arena;
  
  ppvVar1 = RefAt<void*>(x,offset);
  pRVar2 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)*ppvVar1;
  if (pRVar2 == (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)kZeroBuffer) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pRVar2 = Arena::CreateArenaCompatible<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                       (arena);
    *ppvVar1 = pRVar2;
  }
  return pRVar2;
}

Assistant:

static inline T& MaybeCreateRepeatedRefAt(void* x, size_t offset,
                                            MessageLite* msg) {
    if (!is_split) return RefAt<T>(x, offset);
    void*& ptr = RefAt<void*>(x, offset);
    if (ptr == DefaultRawPtr()) {
      ptr = Arena::Create<T>(msg->GetArena());
    }
    return *static_cast<T*>(ptr);
  }